

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O1

string * valueAsString<char_const*>(string *__return_storage_ptr__,char *value)

{
  size_t sVar1;
  
  if (value == (char *)0x0) {
    value = "(unset)";
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar1 = strlen(value);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,value,value + sVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string valueAsString<const char*>(const char* value)
{
  return value ? value : "(unset)";
}